

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdhuff.c
# Opt level: O2

boolean process_restart(j_decompress_ptr cinfo)

{
  uint *puVar1;
  jpeg_marker_reader *pjVar2;
  jpeg_entropy_decoder *pjVar3;
  boolean bVar4;
  long lVar5;
  
  pjVar2 = cinfo->marker;
  pjVar3 = cinfo->entropy;
  puVar1 = &pjVar2->discarded_bytes;
  *puVar1 = *puVar1 + *(int *)&pjVar3[1].decode_mcu / 8;
  *(undefined4 *)&pjVar3[1].decode_mcu = 0;
  bVar4 = (*pjVar2->read_restart_marker)(cinfo);
  if (bVar4 == 0) {
    bVar4 = 0;
  }
  else {
    for (lVar5 = 0; lVar5 < cinfo->comps_in_scan; lVar5 = lVar5 + 1) {
      *(undefined4 *)((long)&pjVar3[2].start_pass + lVar5 * 4 + 4) = 0;
    }
    *(undefined4 *)&pjVar3[2].start_pass = 0;
    *(uint *)&pjVar3[3].decode_mcu = cinfo->restart_interval;
    bVar4 = 1;
    if (cinfo->unread_marker == 0) {
      *(undefined4 *)((long)&pjVar3[3].start_pass + 4) = 0;
    }
  }
  return bVar4;
}

Assistant:

LOCAL(boolean)
process_restart (j_decompress_ptr cinfo)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  int ci;

  /* Throw away any unused bits remaining in bit buffer; */
  /* include any full bytes in next_marker's count of discarded bytes */
  cinfo->marker->discarded_bytes += entropy->bitstate.bits_left / 8;
  entropy->bitstate.bits_left = 0;

  /* Advance past the RSTn marker */
  if (! (*cinfo->marker->read_restart_marker) (cinfo))
    return FALSE;

  /* Re-initialize DC predictions to 0 */
  for (ci = 0; ci < cinfo->comps_in_scan; ci++)
    entropy->saved.last_dc_val[ci] = 0;
  /* Re-init EOB run count, too */
  entropy->saved.EOBRUN = 0;

  /* Reset restart counter */
  entropy->restarts_to_go = cinfo->restart_interval;

  /* Reset out-of-data flag, unless read_restart_marker left us smack up
   * against a marker.  In that case we will end up treating the next data
   * segment as empty, and we can avoid producing bogus output pixels by
   * leaving the flag set.
   */
  if (cinfo->unread_marker == 0)
    entropy->insufficient_data = FALSE;

  return TRUE;
}